

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_shutdown_notice(nghttp2_session *session)

{
  nghttp2_session *session_local;
  
  if (session->server == '\0') {
    session_local._4_4_ = -0x207;
  }
  else if (session->goaway_flags == '\0') {
    session_local._4_4_ = nghttp2_session_add_goaway(session,0x7fffffff,0,(uint8_t *)0x0,0,'\x02');
  }
  else {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_shutdown_notice(nghttp2_session *session) {
  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }
  if (session->goaway_flags) {
    return 0;
  }
  return nghttp2_session_add_goaway(session, (1u << 31) - 1, NGHTTP2_NO_ERROR,
                                    NULL, 0,
                                    NGHTTP2_GOAWAY_AUX_SHUTDOWN_NOTICE);
}